

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QDockAreaLayoutItem>::assign<QDockAreaLayoutItem_const*,q20::identity>
          (QArrayDataPointer<QDockAreaLayoutItem> *this,QDockAreaLayoutItem *first,
          QDockAreaLayoutItem *last)

{
  Data *pDVar1;
  long newSize;
  qsizetype qVar2;
  QDockAreaLayoutItem *__first;
  QDockAreaLayoutItem *pQVar3;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QDockAreaLayoutItem>_*,_QDockAreaLayoutItem_*> pVar4;
  QArrayDataPointer<QDockAreaLayoutItem> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  newSize = ((long)last - (long)first) / 0x28;
  pDVar1 = this->d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc < newSize)) {
    qVar2 = detachCapacity(this,newSize);
    pVar4 = QTypedArrayData<QDockAreaLayoutItem>::allocate(qVar2,KeepSize);
    local_58.d = this->d;
    local_58.ptr = this->ptr;
    this->d = pVar4.first;
    this->ptr = pVar4.second;
    local_58.size = this->size;
    this->size = 0;
    ~QArrayDataPointer(&local_58);
  }
  qVar2 = freeSpaceAtBegin(this);
  __first = this->ptr + -qVar2;
  pQVar3 = this->ptr;
  if (qVar2 != 0) {
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::truncate
              ((QGenericArrayOps<QDockAreaLayoutItem> *)this,(char *)0x0,-qVar2);
    this->ptr = __first;
    pQVar3 = __first;
  }
  pQVar3 = pQVar3 + this->size;
  do {
    if (first == last) {
      std::_Destroy_aux<false>::__destroy<QDockAreaLayoutItem*>(__first,pQVar3);
LAB_00408570:
      this->size = ((long)__first - (long)this->ptr) / 0x28;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    if (__first == pQVar3) {
      __first = std::__uninitialized_copy<false>::
                __uninit_copy<QDockAreaLayoutItem_const*,QDockAreaLayoutItem*>(first,last,pQVar3);
      goto LAB_00408570;
    }
    QDockAreaLayoutItem::operator=(__first,first);
    __first = __first + 1;
    first = first + 1;
  } while( true );
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }